

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getCentroidalTotalMomentum
          (KinDynComputations *this,Span<double,__1L> spatial_momentum)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  pointer __dest;
  Index size;
  SrcEvaluatorType srcEvaluator;
  ulong uVar4;
  uint uVar5;
  uint uVar7;
  Matrix<double,_6,_1,_0,_6,_1> ret;
  undefined8 local_98 [6];
  SpatialMomentum local_68;
  ulong uVar6;
  
  __dest = spatial_momentum.storage_.data_;
  if (spatial_momentum.storage_.super_extent_type<_1L>.size_.size_ == 6) {
    getCentroidalTotalMomentum(&local_68,this);
    local_98[0] = local_68._8_8_;
    local_98[1] = local_68._16_8_;
    local_98[2] = local_68._24_8_;
    local_98[3] = local_68._32_8_;
    local_98[4] = local_68._40_8_;
    local_98[5] = local_68._48_8_;
    uVar5 = (uint)((ulong)__dest >> 3) & 1;
    uVar6 = (ulong)uVar5;
    uVar4 = 6;
    if (((undefined1  [16])spatial_momentum.storage_ & (undefined1  [16])0x7) ==
        (undefined1  [16])0x0) {
      uVar4 = uVar6;
    }
    iVar1 = (int)uVar4;
    uVar7 = 6 - iVar1;
    if (uVar4 != 0) {
      memcpy(__dest,local_98,(ulong)(uint)(iVar1 * 8));
    }
    uVar4 = (uVar7 & 0xfffffffe) + uVar4;
    if (((undefined1  [16])spatial_momentum.storage_ & (undefined1  [16])0x7) ==
        (undefined1  [16])0x0) {
      uVar2 = (ulong)(uVar5 * 8);
      uVar3 = uVar6 + 2;
      if (uVar6 + 2 < uVar4) {
        uVar3 = uVar4;
      }
      memcpy((void *)((long)__dest + uVar2),(void *)((long)local_98 + uVar2),
             (~uVar6 + uVar3 & 0xffffffffffffffe) * 8 + 0x10);
    }
    if ((uint)uVar4 < 6) {
      uVar4 = (ulong)((iVar1 + (uVar7 & 0xfffffffe)) * 8);
      memcpy((void *)((long)__dest + uVar4),(void *)((long)local_98 + uVar4),(ulong)(uVar7 * 8 & 8))
      ;
    }
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_68.super_SpatialForceVector);
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getCentroidalTotalMomentum",
               "Wrong size in input spatial_momentum");
  }
  return spatial_momentum.storage_.super_extent_type<_1L>.size_.size_ == 6;
}

Assistant:

bool KinDynComputations::getCentroidalTotalMomentum(iDynTree::Span<double> spatial_momentum)
{
    constexpr int expected_spatial_momentum_size = 6;
    bool ok = spatial_momentum.size() == expected_spatial_momentum_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCentroidalTotalMomentum","Wrong size in input spatial_momentum");
        return false;
    }

    toEigen(spatial_momentum) = toEigen(getCentroidalTotalMomentum());

    return true;
}